

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O1

void multikey_simd<unsigned_short>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  uint8_t *N_00;
  size_t sVar4;
  unsigned_short pivot;
  ushort uVar5;
  int iVar6;
  size_t i;
  long lVar7;
  void *__src;
  uchar **ppuVar8;
  uchar **ppuVar9;
  byte bVar10;
  byte bVar11;
  uint8_t *oracle;
  ulong n;
  long lVar12;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  char local_82;
  uint8_t *local_78;
  size_t sStack_70;
  size_t local_68;
  uint8_t *local_60;
  size_t local_58;
  size_t local_50;
  long local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (N < 0x20) {
    if (1 < (long)N) {
      ppuVar8 = strings;
      do {
        iVar6 = (int)N;
        N = (size_t)(iVar6 - 1);
        puVar1 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar9 = ppuVar8; strings < ppuVar9; ppuVar9 = ppuVar9 + -1) {
          puVar2 = ppuVar9[-1];
          bVar10 = puVar2[depth];
          bVar11 = puVar1[depth];
          if ((bVar10 != 0) && (lVar7 = depth + 1, bVar10 == bVar11)) {
            do {
              bVar10 = puVar2[lVar7];
              bVar11 = puVar1[lVar7];
              if (bVar10 == 0) break;
              lVar7 = lVar7 + 1;
            } while (bVar10 == bVar11);
          }
          if (bVar10 <= bVar11) break;
          *ppuVar9 = puVar2;
        }
        *ppuVar9 = puVar1;
      } while (2 < iVar6);
    }
  }
  else {
    pivot = pseudo_median<unsigned_short>(strings,N,depth);
    iVar6 = posix_memalign(&local_78,0x10,N);
    oracle = local_78;
    if (iVar6 != 0) {
      oracle = (uint8_t *)0x0;
    }
    local_78 = (uint8_t *)0x0;
    sStack_70 = 0;
    local_68 = 0;
    n = N & 0xfffffffffffffff0;
    calculate_bucketsizes_sse<false>(strings,n,oracle,pivot,depth);
    if (n != N) {
      do {
        puVar1 = strings[n];
        if (puVar1 == (uchar *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
        }
        if (puVar1[depth] == '\0') {
          uVar5 = 0;
        }
        else {
          uVar5 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        oracle[n] = (pivot <= uVar5 && uVar5 != pivot) * '\x02' | uVar5 == pivot;
        n = n + 1;
      } while (n < N);
    }
    lVar12 = N + (N == 0);
    lVar7 = 0;
    do {
      (&local_78)[oracle[lVar7]] = (&local_78)[oracle[lVar7]] + 1;
      N_00 = local_78;
      lVar7 = lVar7 + 1;
    } while (lVar12 != lVar7);
    local_58 = sStack_70;
    local_60 = local_78 + sStack_70;
    local_50 = local_68;
    if (local_60 + local_68 != (uint8_t *)N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x127,
                    "void multikey_simd(unsigned char **, size_t, size_t) [CharT = unsigned short]")
      ;
    }
    __src = malloc(N << 3);
    local_48 = 0;
    local_40 = N_00;
    local_38 = local_60;
    lVar7 = 0;
    do {
      puVar1 = strings[lVar7];
      lVar3 = (&local_48)[oracle[lVar7]];
      (&local_48)[oracle[lVar7]] = lVar3 + 1;
      *(uchar **)((long)__src + lVar3 * 8) = puVar1;
      lVar7 = lVar7 + 1;
    } while (lVar12 != lVar7);
    memcpy(strings,__src,N << 3);
    free(__src);
    free(oracle);
    multikey_simd<unsigned_short>(strings,(size_t)N_00,depth);
    sVar4 = local_58;
    local_82 = (char)pivot;
    if (local_82 != '\0') {
      multikey_simd<unsigned_short>(strings + (long)N_00,local_58,depth + 2);
    }
    multikey_simd<unsigned_short>(strings + (long)(N_00 + sVar4),local_50,depth);
  }
  return;
}

Assistant:

static void
multikey_simd(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
	multikey_simd<CharT>(strings, bucketsize[0], depth);
	if (not is_end(partval))
		multikey_simd<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
	multikey_simd<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
}